

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O0

void __thiscall helics::Publication::publishComplex(Publication *this,double *vals,int size)

{
  undefined1 uVar1;
  int in_EDX;
  defV *in_RDI;
  SmallBuffer db_1;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_000000e0;
  SmallBuffer db;
  int ii;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> CV;
  SmallBuffer *in_stack_fffffffffffffe80;
  SmallBuffer *this_00;
  double *in_stack_fffffffffffffe88;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_fffffffffffffe90;
  SmallBuffer *in_stack_fffffffffffffe98;
  data_view *in_stack_fffffffffffffea0;
  data_view *this_01;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  ValueFederate *in_stack_fffffffffffffeb0;
  ValueFederate *this_02;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_stack_fffffffffffffec0;
  SmallBuffer local_120;
  data_view local_c0 [4];
  int local_40;
  int local_14;
  
  if ((in_RDI[1].
       super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
       .
       super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
       .
       super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
       .
       super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
       .
       super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
       .
       super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
       .field_0x2c & 1) == 0) {
    this_00 = &local_120;
    typeConvertComplex(db_1.bufferSize._4_4_,(double *)db_1.buffer._M_elems._56_8_,
                       db_1.buffer._M_elems._48_8_);
    data_view::data_view(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    helics::ValueFederate::publishBytes
              (in_stack_fffffffffffffeb0,
               (Publication *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
               in_stack_fffffffffffffea0);
    data_view::~data_view((data_view *)0x3ad4df);
    SmallBuffer::~SmallBuffer(this_00);
  }
  else {
    this_02 = (ValueFederate *)&stack0xffffffffffffffd0;
    local_14 = in_EDX;
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x3ad2d7);
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)this_02,
               CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    for (local_40 = 0; local_40 < local_14; local_40 = local_40 + 1) {
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      emplace_back<double_const&,double_const&>
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                 (double *)in_stack_fffffffffffffe80);
    }
    uVar1 = changeDetected(in_RDI,(vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                   *)this_02,
                           (double)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    if ((bool)uVar1) {
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=(in_stack_fffffffffffffec0,
                  (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)in_RDI);
      typeConvert(db.buffer._M_elems._4_4_,in_stack_000000e0);
      this_01 = local_c0;
      data_view::data_view
                (this_01,*(SmallBuffer **)
                          ((long)&in_RDI[1].
                                  super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                                  .
                                  super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                                  .
                                  super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                                  .
                                  super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                                  .
                                  super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                                  .
                                  super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
                                  ._M_u + 8));
      helics::ValueFederate::publishBytes
                (this_02,(Publication *)CONCAT17(uVar1,in_stack_fffffffffffffea8),this_01);
      data_view::~data_view((data_view *)0x3ad413);
      SmallBuffer::~SmallBuffer(in_stack_fffffffffffffe80);
    }
    CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
              (in_stack_fffffffffffffe90);
  }
  return;
}

Assistant:

void Publication::publishComplex(const double* vals, int size)
{
    if (changeDetectionEnabled) {
        std::vector<std::complex<double>> CV;
        CV.reserve(size);
        for (int ii = 0; ii < size; ++ii) {
            CV.emplace_back(vals[2 * ii], vals[2 * ii + 1]);
        }
        if (changeDetected(prevValue, CV, delta)) {
            prevValue = CV;
            auto db = typeConvert(pubType, CV);
            fed->publishBytes(*this, db);
        }
    } else {
        auto db = typeConvertComplex(pubType, vals, size);
        fed->publishBytes(*this, db);
    }
}